

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmilankoviccalendar.cpp
# Opt level: O1

YearMonthDay __thiscall QMilankovicCalendar::julianDayToDate(QMilankovicCalendar *this,qint64 jd)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  R_conflict20 RVar6;
  YearMonthDay YVar7;
  
  uVar5 = jd * 9 - 0xec5c1e;
  if ((long)uVar5 < 0) {
    lVar3 = jd * 9 + -0xec5c1d;
    lVar1 = -(lVar3 >> 0x3f);
    lVar4 = lVar3 / 0x5040e + (lVar3 >> 0x3f);
    iVar2 = (int)lVar4 + (int)lVar1 + -1;
    uVar5 = lVar3 + (lVar4 + lVar1) * -0x5040e + 0x5040d;
  }
  else {
    iVar2 = (int)(uVar5 / 0x5040e);
    uVar5 = uVar5 % 0x5040e;
  }
  uVar5 = (uVar5 / 9) * 100 + 99;
  RVar6 = QRomanCalendrical::dayInYearToYmd((int)((uVar5 % 0x8ead) / 100));
  YVar7.day = RVar6.day;
  iVar2 = RVar6.year + (int)(uVar5 / 0x8ead) + iVar2 * 100;
  YVar7._0_8_ = RVar6._0_8_ & 0xffffffff00000000 | (ulong)(iVar2 - (uint)(iVar2 < 1));
  return YVar7;
}

Assistant:

QCalendar::YearMonthDay  QMilankovicCalendar::julianDayToDate(qint64 jd) const
{
    const auto century9Day = qDivMod<NineCenturies>(9 * (jd - MilankovicBaseJd) - 7);
    // Its remainder changes by 9 per day, except roughly once per century.
    const auto year100Day = qDivMod<LeapCentury>(100 * qDiv<9>(century9Day.remainder) + 99);
    // Its remainder changes by 100 per day, except roughly once per year.
    const auto ymd = dayInYearToYmd(qDiv<100>(year100Day.remainder));
    const int y = 100 * century9Day.quotient + year100Day.quotient + ymd.year;
    return QCalendar::YearMonthDay(y > 0 ? y : y - 1, ymd.month, ymd.day);
}